

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O0

bool __thiscall
cmComputeLinkInformation::CheckImplicitDirItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  cmake *this_00;
  string *prop;
  bool bVar1;
  PolicyStatus PVar2;
  pointer this_01;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  cmListFileBacktrace local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_170;
  undefined1 local_140 [8];
  LinkEntry fileEntry;
  allocator<char> local_c1;
  string local_c0;
  string local_a0;
  string *local_80;
  string *wid;
  string file;
  undefined1 local_48 [8];
  string dir;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *item;
  LinkEntry *entry_local;
  cmComputeLinkInformation *this_local;
  
  if ((this->LinkTypeEnabled & 1U) == 0) {
    return false;
  }
  dir.field_2._8_8_ = entry;
  cmsys::SystemTools::GetFilenamePath((string *)local_48,(string *)entry);
  bVar1 = ::cm::
          contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&this->ImplicitLinkDirs,(string *)local_48);
  if (!bVar1) {
    this_local._7_1_ = false;
    file.field_2._8_4_ = 1;
    goto LAB_00893c18;
  }
  cmsys::SystemTools::GetFilenameName((string *)&wid,(string *)dir.field_2._8_8_);
  bVar1 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,(string *)&wid);
  if (bVar1) {
    PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0060(this->Target);
    if (PVar2 != OLD) {
      if (PVar2 == WARN) {
        if ((this->CMP0060Warn & 1U) != 0) {
          cmStrCat<char_const(&)[23],std::__cxx11::string_const&>
                    (&local_a0,(char (*) [23])"CMP0060-WARNING-GIVEN-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     dir.field_2._8_8_);
          local_80 = &local_a0;
          bVar1 = cmake::GetPropertyAsBool(this->CMakeInstance,local_80);
          prop = local_80;
          if (!bVar1) {
            this_00 = this->CMakeInstance;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"1",&local_c1);
            cmake::SetProperty(this_00,prop,&local_c0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::allocator<char>::~allocator(&local_c1);
            pVar3 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert(&this->CMP0060WarnItems,(value_type *)dir.field_2._8_8_);
            fileEntry.Feature.field_2._8_8_ = pVar3.first._M_node;
          }
          std::__cxx11::string::~string((string *)&local_a0);
        }
      }
      else if (PVar2 - NEW < 3) {
        this_local._7_1_ = false;
        file.field_2._8_4_ = 1;
        goto LAB_00893c02;
      }
    }
    cmComputeLinkDepends::LinkEntry::LinkEntry((LinkEntry *)local_140,entry);
    std::__cxx11::string::string((string *)&local_190,(string *)&wid);
    local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1a8.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_1a8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_170,&local_190,&local_1a8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
              ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_140,&local_170);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_170);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1a8);
    std::__cxx11::string::~string((string *)&local_190);
    AddUserItem(this,(LinkEntry *)local_140,false);
    this_01 = std::unique_ptr<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>::
              operator->(&this->OrderLinkerSearchPath);
    cmOrderDirectories::AddLinkLibrary(this_01,(string *)dir.field_2._8_8_);
    this_local._7_1_ = true;
    file.field_2._8_4_ = 1;
    cmComputeLinkDepends::LinkEntry::~LinkEntry((LinkEntry *)local_140);
  }
  else {
    this_local._7_1_ = false;
    file.field_2._8_4_ = 1;
  }
LAB_00893c02:
  std::__cxx11::string::~string((string *)&wid);
LAB_00893c18:
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmComputeLinkInformation::CheckImplicitDirItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;

  // We only switch to a pathless item if the link type may be
  // enforced.  Fortunately only platforms that support link types
  // seem to have magic per-architecture implicit link directories.
  if (!this->LinkTypeEnabled) {
    return false;
  }

  // Check if this item is in an implicit link directory.
  std::string dir = cmSystemTools::GetFilenamePath(item.Value);
  if (!cm::contains(this->ImplicitLinkDirs, dir)) {
    // Only libraries in implicit link directories are converted to
    // pathless items.
    return false;
  }

  // Only apply the policy below if the library file is one that can
  // be found by the linker.
  std::string file = cmSystemTools::GetFilenameName(item.Value);
  if (!this->ExtractAnyLibraryName.find(file)) {
    return false;
  }

  // Check the policy for whether we should use the approach below.
  switch (this->Target->GetPolicyStatusCMP0060()) {
    case cmPolicies::WARN:
      if (this->CMP0060Warn) {
        // Print the warning at most once for this item.
        std::string const& wid =
          cmStrCat("CMP0060-WARNING-GIVEN-", item.Value);
        if (!this->CMakeInstance->GetPropertyAsBool(wid)) {
          this->CMakeInstance->SetProperty(wid, "1");
          this->CMP0060WarnItems.insert(item.Value);
        }
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::NEW:
      return false;
  }

  // Many system linkers support multiple architectures by
  // automatically selecting the implicit linker search path for the
  // current architecture.  If the library appears in an implicit link
  // directory then just report the file name without the directory
  // portion.  This will allow the system linker to locate the proper
  // library for the architecture at link time.
  LinkEntry fileEntry{ entry };
  fileEntry.Item = file;
  this->AddUserItem(fileEntry, false);

  // Make sure the link directory ordering will find the library.
  this->OrderLinkerSearchPath->AddLinkLibrary(item.Value);

  return true;
}